

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplesort.hpp
# Opt level: O1

vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> * __thiscall
mxx::impl::
sample_block_decomp<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>,std::less<TwoBSA<unsigned_long>>>
          (vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
           *__return_storage_ptr__,impl *this,long begin,int param_4,long param_5,undefined8 param_6
          )

{
  impl *piVar1;
  undefined8 *puVar2;
  int iVar3;
  undefined8 uVar4;
  pointer pTVar5;
  long lVar6;
  undefined8 *puVar7;
  undefined8 uVar8;
  ulong uVar9;
  size_type sVar10;
  ulong uVar11;
  allocator_type local_61;
  long local_60;
  undefined8 local_58;
  int rank;
  undefined4 uStack_4c;
  pointer local_48;
  size_type local_38;
  
  local_60 = param_5;
  local_58 = param_6;
  if (begin - (long)this == 0) {
    MPI_Comm_rank(&ompi_mpi_comm_world,&rank);
    printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",(ulong)(uint)rank,
           "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/samplesort.hpp"
           ,0xa9,"sample_block_decomp","local_size > 0");
    fflush(_stdout);
    MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
  }
  iVar3 = *(int *)(local_60 + 0x10);
  local_38 = (size_type)param_4;
  std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::vector
            (__return_storage_ptr__,local_38,(allocator_type *)&rank);
  uVar8 = local_58;
  pTVar5 = (__return_storage_ptr__->
           super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((__return_storage_ptr__->
      super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>)._M_impl.
      super__Vector_impl_data._M_finish != pTVar5) {
    uVar11 = (begin - (long)this >> 3) * -0x5555555555555555;
    lVar6 = 0;
    uVar9 = 0;
    do {
      piVar1 = this + ((uVar11 / (ulong)(long)(param_4 + 1) - 1) +
                      (ulong)(uVar9 < uVar11 % (ulong)(long)(param_4 + 1))) * 0x18;
      this = piVar1 + 0x18;
      *(undefined8 *)((long)&pTVar5->SA + lVar6) = *(undefined8 *)(piVar1 + 0x10);
      uVar4 = *(undefined8 *)(piVar1 + 8);
      puVar7 = (undefined8 *)((long)&pTVar5->B1 + lVar6);
      *puVar7 = *(undefined8 *)piVar1;
      puVar7[1] = uVar4;
      uVar9 = uVar9 + 1;
      pTVar5 = (__return_storage_ptr__->
               super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x18;
    } while (uVar9 < (ulong)(((long)(__return_storage_ptr__->
                                    super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar5 >> 3)
                            * -0x5555555555555555));
  }
  if (*(int *)(local_60 + 0x14) == 0) {
    std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::vector
              ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)&rank,
               (long)(iVar3 * param_4),&local_61);
    uVar8 = local_58;
    MPI_Gather();
    pTVar5 = (pointer)CONCAT44(uStack_4c,rank);
    if (pTVar5 != local_48) {
      uVar9 = ((long)local_48 - (long)pTVar5 >> 3) * -0x5555555555555555;
      lVar6 = 0x3f;
      if (uVar9 != 0) {
        for (; uVar9 >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::less<TwoBSA<unsigned_long>>>>
                (pTVar5,local_48,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<TwoBSA<unsigned_long>>>>
                ();
    }
    sVar10 = (long)iVar3 - 1;
    if (((long)(__return_storage_ptr__->
               super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>).
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(__return_storage_ptr__->
               super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>).
               _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - sVar10 != 0) {
      std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::resize
                (__return_storage_ptr__,sVar10);
    }
    pTVar5 = (__return_storage_ptr__->
             super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if ((__return_storage_ptr__->
        super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>)._M_impl.
        super__Vector_impl_data._M_finish != pTVar5) {
      puVar7 = (undefined8 *)(CONCAT44(uStack_4c,rank) + local_38 * 0x18 + -0x18);
      lVar6 = 0;
      uVar9 = 0;
      do {
        *(undefined8 *)((long)&pTVar5->SA + lVar6) = puVar7[2];
        uVar4 = puVar7[1];
        puVar2 = (undefined8 *)((long)&pTVar5->B1 + lVar6);
        *puVar2 = *puVar7;
        puVar2[1] = uVar4;
        uVar9 = uVar9 + 1;
        pTVar5 = (__return_storage_ptr__->
                 super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar6 = lVar6 + 0x18;
        puVar7 = puVar7 + local_38 * 3;
      } while (uVar9 < (ulong)(((long)(__return_storage_ptr__->
                                      super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar5 >>
                               3) * -0x5555555555555555));
    }
    if ((void *)CONCAT44(uStack_4c,rank) != (void *)0x0) {
      operator_delete((void *)CONCAT44(uStack_4c,rank));
    }
  }
  else {
    MPI_Gather(pTVar5,param_4,local_58,0,0,local_58,0,*(undefined8 *)(local_60 + 8));
    sVar10 = (long)iVar3 - 1;
    if (((long)(__return_storage_ptr__->
               super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>).
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(__return_storage_ptr__->
               super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>).
               _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - sVar10 != 0) {
      std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::resize
                (__return_storage_ptr__,sVar10);
    }
  }
  pTVar5 = (__return_storage_ptr__->
           super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  MPI_Bcast(pTVar5,(int)((ulong)((long)(__return_storage_ptr__->
                                       super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar5)
                        >> 3) * -0x55555555,uVar8,0,*(undefined8 *)(local_60 + 8));
  return __return_storage_ptr__;
}

Assistant:

std::vector<typename std::iterator_traits<_Iterator>::value_type>
sample_block_decomp(_Iterator begin, _Iterator end, _Compare comp, int s, const mxx::comm& comm, MPI_Datatype mpi_dt)
{
    typedef typename std::iterator_traits<_Iterator>::value_type value_type;
    std::size_t local_size = std::distance(begin, end);
    MXX_ASSERT(local_size > 0);
    int p = comm.size();

    // 1. samples
    //  - pick `s` samples equally spaced such that `s` samples define `s+1`
    //    subsequences in the sorted order
    std::vector<value_type> local_splitters(s);
    _Iterator pos = begin;
    for (std::size_t i = 0; i < local_splitters.size(); ++i) {
        std::size_t bucket_size = local_size / (s+1) + (i < (local_size % (s+1)) ? 1 : 0);
        // pick last element of each bucket
        pos += (bucket_size-1);
        local_splitters[i] = *pos;
        ++pos;
    }

    // 2. gather samples to `rank = 0`
    // - TODO: rather call sample sort
    //         recursively and implement a base case for samplesort which does
    //         gather to rank=0, local sort and redistribute
    if (comm.rank() == 0) {
        std::vector<value_type> all_samples(p*s);
        MPI_Gather(&local_splitters[0], s, mpi_dt,
                   &all_samples[0], s, mpi_dt, 0, comm);

        // 3. local sort on master
        std::sort(all_samples.begin(), all_samples.end(), comp);

        // 4. pick p-1 splitters and broadcast them
        if (local_splitters.size() != (size_t) p-1) {
            local_splitters.resize(p-1);
        }
        // split into `p` pieces and choose the `p-1` splitting elements
        _Iterator pos = all_samples.begin();
        for (std::size_t i = 0; i < local_splitters.size(); ++i)
        {
            std::size_t bucket_size = (p*s) / p + (i < static_cast<std::size_t>((p*s) % p) ? 1 : 0);
            // pick last element of each bucket
            local_splitters[i] = *(pos + (bucket_size-1));
            pos += bucket_size;
        }
    }
    else
    {
        // simply send
        MPI_Gather(&local_splitters[0], s, mpi_dt, NULL, 0, mpi_dt, 0, comm);

        // resize splitters for receiving
        if (local_splitters.size() != (size_t) p-1) {
            local_splitters.resize(p-1);
        }
    }

    // 4. broadcast and receive final splitters
    MPI_Bcast(&local_splitters[0], local_splitters.size(), mpi_dt, 0, comm);

    return local_splitters;
}